

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  string *psVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  pointer ppVar7;
  ostream *poVar8;
  pointer pEVar9;
  mapped_type *this;
  Fatal *pFVar10;
  size_type sVar11;
  long lVar12;
  mapped_type *pmVar13;
  allocator<char> local_1271;
  key_type local_1270;
  string local_1250 [32];
  string local_1230;
  string local_1210;
  undefined1 local_11f0 [8];
  ModuleWriter writer;
  key_type local_1170;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1148;
  allocator<char> local_1119;
  string local_1118 [40];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10f0;
  allocator<char> local_10c1;
  string local_10c0 [32];
  PassRunner local_10a0 [8];
  PassRunner passRunner;
  Fatal local_fb0;
  undefined1 local_e21;
  string_view local_e20;
  pointer local_e10;
  ExportInfo local_e08;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *local_de8;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range3;
  undefined1 local_c39 [401];
  ParseException *p;
  string local_a88 [36];
  undefined1 local_a64 [8];
  ModuleReader reader;
  Module *local_a50;
  Module *currModule;
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> laterInput;
  _Self local_a38;
  string local_a30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> inputSourceMapFilename;
  _Self local_a08;
  iterator iter;
  value_type inputFileName;
  value_type inputFile;
  undefined1 local_9b8 [4];
  Index i;
  anon_class_8_1_09c29441 local_830;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_828;
  allocator<char> local_801;
  string local_800 [39];
  allocator<char> local_7d9;
  string local_7d8 [39];
  allocator<char> local_7b1;
  string local_7b0 [32];
  anon_class_8_1_29de6772 local_790;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_788;
  allocator<char> local_761;
  string local_760 [39];
  allocator<char> local_739;
  string local_738 [39];
  allocator<char> local_711;
  string local_710 [39];
  anon_class_1_0_00000001 local_6e9;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_6e8;
  allocator<char> local_6c1;
  string local_6c0 [39];
  allocator<char> local_699;
  string local_698 [39];
  allocator<char> local_671;
  string local_670 [39];
  anon_class_1_0_00000001 local_649;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_648;
  allocator<char> local_621;
  string local_620 [39];
  allocator<char> local_5f9;
  string local_5f8 [39];
  allocator<char> local_5d1;
  string local_5d0 [32];
  anon_class_8_1_79fd1ccd local_5b0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_5a8;
  allocator<char> local_581;
  string local_580 [39];
  allocator<char> local_559;
  string local_558 [39];
  allocator<char> local_531;
  string local_530 [32];
  anon_class_8_1_4038aa47 local_510;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_508;
  allocator<char> local_4e1;
  string local_4e0 [39];
  allocator<char> local_4b9;
  string local_4b8 [39];
  allocator<char> local_491;
  string local_490 [32];
  anon_class_24_3_d5ad41a7 local_470;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_458;
  allocator<char> local_431;
  string local_430 [39];
  allocator<char> local_409;
  string local_408 [39];
  allocator<char> local_3e1;
  string local_3e0 [32];
  anon_class_16_2_87d1826e local_3c0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_3b0;
  allocator<char> local_389;
  string local_388 [39];
  anon_class_1_0_00000001 local_361;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_360;
  allocator<char> local_339;
  string local_338 [39];
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [39];
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  undefined1 local_278 [8];
  ToolOptions options;
  allocator<char> local_e1;
  string local_e0 [8];
  string WasmMergeOption;
  string outputSourceMapUrl;
  string outputSourceMapFilename;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  inputSourceMapFilenames;
  undefined1 local_48 [6];
  bool debugInfo;
  bool emitBinary;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputFileNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputFiles;
  char **argv_local;
  int argc_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&inputFileNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  std::
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)((long)&outputSourceMapFilename.field_2 + 8));
  std::__cxx11::string::string((string *)(outputSourceMapUrl.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(WasmMergeOption.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"wasm-merge options",&local_e1);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"wasm-merge",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,
             "Merge wasm files into one.\n\nFor example,\n\n  wasm-merge foo.wasm foo bar.wasm bar -o merged.wasm\n\nwill read foo.wasm and bar.wasm, with names \'foo\' and \'bar\' respectively, so if the second imports from \'foo\', we will see that as an import from the first module after the merge. The merged output will be written to merged.wasm.\n\nNote that filenames and modules names are interleaved (which is hopefully less confusing).\n\nInput source maps can be specified by adding an -ism option right after the module name:\n\n  wasm-merge foo.wasm foo -ism foo.wasm.map ..."
             ,&local_2c1);
  wasm::ToolOptions::ToolOptions((ToolOptions *)local_278,&local_298,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e8,"--output",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_310,"-o",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_338,"Output file",&local_339);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_360,&local_361);
  psVar3 = (string *)
           wasm::Options::add((string *)&options,local_2e8,local_310,local_338,(Arguments)local_e0,
                              (function *)0x1,SUB81(&local_360,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_388,"INFILE1 NAME1 INFILE2 NAME2 [..]",&local_389);
  local_3c0.inputFiles =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&inputFileNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3c0.inputFileNames =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_48;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__1,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_3b0,&local_3c0);
  psVar3 = (string *)wasm::Options::add_positional(psVar3,(Arguments)local_388,(function *)0x2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"--input-source-map",&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_408,"-ism",&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_430,"Consume source maps from the specified files",&local_431);
  local_470.inputFiles =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&inputFileNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_470.inputFileNames =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_48;
  local_470.inputSourceMapFilenames =
       (map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)((long)&outputSourceMapFilename.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__2,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_458,&local_470);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_3e0,local_408,local_430,(Arguments)local_e0,
                              (function *)0x2,SUB81(&local_458,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_490,"--output-source-map",&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4b8,"-osm",&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4e0,"Emit source map to the specified file",&local_4e1);
  local_510.outputSourceMapFilename = (string *)((long)&outputSourceMapUrl.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__3,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_508,&local_510);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_490,local_4b8,local_4e0,(Arguments)local_e0,
                              (function *)0x1,SUB81(&local_508,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_530,"--output-source-map-url",&local_531)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_558,"-osu",&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_580,"Emit specified string as source map URL",&local_581);
  local_5b0.outputSourceMapUrl = (string *)((long)&WasmMergeOption.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__4,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_5a8,&local_5b0);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_530,local_558,local_580,(Arguments)local_e0,
                              (function *)0x1,SUB81(&local_5a8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5d0,"--rename-export-conflicts",&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5f8,"-rec",&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_620,"Rename exports to avoid conflicts (rather than error)",&local_621);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__5,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_648,&local_649);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_5d0,local_5f8,local_620,(Arguments)local_e0,
                              (function *)0x0,SUB81(&local_648,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_670,"--skip-export-conflicts",&local_671)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_698,"-sec",&local_699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6c0,"Skip exports that conflict with previous ones",&local_6c1);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__6,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_6e8,&local_6e9);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_670,local_698,local_6c0,(Arguments)local_e0,
                              (function *)0x0,SUB81(&local_6e8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_710,"--emit-text",&local_711);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_738,"-S",&local_739);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_760,"Emit text instead of binary for the output file",&local_761);
  local_790.emitBinary =
       (bool *)((long)&inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
  ;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__7,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_788,&local_790);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_710,local_738,local_760,(Arguments)local_e0,
                              (function *)0x0,SUB81(&local_788,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7b0,"--debuginfo",&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7d8,"-g",&local_7d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_800,"Emit names section and debug info",&local_801);
  local_830.debugInfo =
       (bool *)((long)&inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count + 6)
  ;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__8,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_828,&local_830);
  wasm::Options::add(psVar3,local_7b0,local_7d8,local_800,(Arguments)local_e0,(function *)0x0,
                     SUB81(&local_828,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_828);
  std::__cxx11::string::~string(local_800);
  std::allocator<char>::~allocator(&local_801);
  std::__cxx11::string::~string(local_7d8);
  std::allocator<char>::~allocator(&local_7d9);
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_788);
  std::__cxx11::string::~string(local_760);
  std::allocator<char>::~allocator(&local_761);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator(&local_739);
  std::__cxx11::string::~string(local_710);
  std::allocator<char>::~allocator(&local_711);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_6e8);
  std::__cxx11::string::~string(local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator(&local_699);
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::~allocator(&local_671);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_648);
  std::__cxx11::string::~string(local_620);
  std::allocator<char>::~allocator(&local_621);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_5a8);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator(&local_581);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator(&local_559);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator(&local_531);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_508);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator(&local_491);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_458);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator(&local_409);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_3b0);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator(&local_389);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_360);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  wasm::Options::parse((int)&options,(char **)(ulong)(uint)argc);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&inputFileNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
  if (sVar4 != sVar5) {
    wasm::Fatal::Fatal((Fatal *)local_9b8);
    wasm::Fatal::operator<<
              ((Fatal *)local_9b8,
               (char (*) [161])
               "Please provide an import name for each input file. In particular, the number of positional inputs must be even as each wasm binary must be followed by its name."
              );
    wasm::Fatal::~Fatal((Fatal *)local_9b8);
  }
  inputFile.field_2._12_4_ = 0;
  while( true ) {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&inputFileNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar4 <= (uint)inputFile.field_2._12_4_) {
      anon_unknown.dwarf_4289b::fuseImportsAndExports();
      wasm::PassRunner::PassRunner(local_10a0,(Module *)(anonymous_namespace)::merged);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_10c0,"reorder-globals-always",&local_10c1);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      wasm::PassRunner::add(local_10a0,local_10c0,&local_10f0);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_10f0);
      std::__cxx11::string::~string(local_10c0);
      std::allocator<char>::~allocator(&local_10c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1118,"remove-unused-module-elements",&local_1119);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      wasm::PassRunner::add(local_10a0,local_1118,&local_1148);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_1148);
      std::__cxx11::string::~string(local_1118);
      std::allocator<char>::~allocator(&local_1119);
      wasm::PassRunner::run();
      wasm::PassRunner::~PassRunner(local_10a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1170,"output",
                 (allocator<char> *)(writer.sourceMapUrl.field_2._M_local_buf + 0xf));
      sVar11 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&options.super_Options,&local_1170);
      std::__cxx11::string::~string((string *)&local_1170);
      std::allocator<char>::~allocator
                ((allocator<char> *)(writer.sourceMapUrl.field_2._M_local_buf + 0xf));
      if (sVar11 != 0) {
        wasm::ModuleWriter::ModuleWriter
                  ((ModuleWriter *)local_11f0,(PassOptions *)&options.field_0xb0);
        wasm::ModuleWriter::setBinary
                  ((ModuleWriter *)local_11f0,
                   (bool)(inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count.
                          _7_1_ & 1));
        wasm::ModuleIOBase::setDebugInfo
                  ((ModuleIOBase *)local_11f0,
                   (bool)(inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count.
                          _6_1_ & 1));
        lVar12 = std::__cxx11::string::size();
        if (lVar12 != 0) {
          std::__cxx11::string::string
                    ((string *)&local_1210,(string *)(outputSourceMapUrl.field_2._M_local_buf + 8));
          wasm::ModuleWriter::setSourceMapFilename((ModuleWriter *)local_11f0,&local_1210);
          std::__cxx11::string::~string((string *)&local_1210);
          std::__cxx11::string::string
                    ((string *)&local_1230,(string *)(WasmMergeOption.field_2._M_local_buf + 8));
          wasm::ModuleWriter::setSourceMapUrl((ModuleWriter *)local_11f0,&local_1230);
          std::__cxx11::string::~string((string *)&local_1230);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1270,"output",&local_1271);
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&options.super_Options,&local_1270);
        std::__cxx11::string::string(local_1250,(string *)pmVar13);
        wasm::ModuleWriter::write(local_11f0,(anonymous_namespace)::merged,local_1250);
        std::__cxx11::string::~string(local_1250);
        std::__cxx11::string::~string((string *)&local_1270);
        std::allocator<char>::~allocator(&local_1271);
        wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)local_11f0);
      }
      wasm::ToolOptions::~ToolOptions((ToolOptions *)local_278);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string((string *)(WasmMergeOption.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(outputSourceMapUrl.field_2._M_local_buf + 8));
      std::
      map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&outputSourceMapFilename.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&inputFileNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return 0;
    }
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&inputFileNames.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (ulong)(uint)inputFile.field_2._12_4_);
    std::__cxx11::string::string
              ((string *)(inputFileName.field_2._M_local_buf + 8),(string *)pvVar6);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_48,(ulong)(uint)inputFile.field_2._12_4_);
    std::__cxx11::string::string((string *)&iter,(string *)pvVar6);
    inputSourceMapFilename.field_2._8_8_ = ZEXT48((uint)inputFile.field_2._12_4_);
    local_a08._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&outputSourceMapFilename.field_2 + 8),
                (key_type *)(inputSourceMapFilename.field_2._M_local_buf + 8));
    local_a38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&outputSourceMapFilename.field_2 + 8));
    bVar1 = std::operator==(&local_a08,&local_a38);
    laterInput._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
    super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl._6_1_ = 0;
    if (bVar1) {
      std::allocator<char>::allocator();
      laterInput._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (local_a30,"",
                 (allocator<char> *)
                 ((long)&laterInput._M_t.
                         super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                         super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 7));
    }
    else {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_a08);
      std::__cxx11::string::string(local_a30,(string *)&ppVar7->second);
    }
    if ((laterInput._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
         super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&laterInput._M_t.
                         super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                         super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl + 7));
    }
    if (((byte)options._vptr_ToolOptions & 1) != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"reading input \'");
      poVar8 = std::operator<<(poVar8,(string *)(inputFileName.field_2._M_local_buf + 8));
      poVar8 = std::operator<<(poVar8,"\' as \'");
      poVar8 = std::operator<<(poVar8,(string *)&iter);
      std::operator<<(poVar8,"\'...\n");
    }
    std::unique_ptr<wasm::Module,std::default_delete<wasm::Module>>::
    unique_ptr<std::default_delete<wasm::Module>,void>
              ((unique_ptr<wasm::Module,std::default_delete<wasm::Module>> *)&currModule);
    if (inputFile.field_2._12_4_ == 0) {
      local_a50 = (Module *)(anonymous_namespace)::merged;
    }
    else {
      std::make_unique<wasm::Module>();
      std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator=
                ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&currModule,
                 (unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&reader.profile);
      std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
                ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&reader.profile);
      local_a50 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::get
                            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)
                             &currModule);
    }
    wasm::ToolOptions::applyOptionsBeforeParse((ToolOptions *)local_278,local_a50);
    wasm::ModuleReader::ModuleReader((ModuleReader *)local_a64);
    std::__cxx11::string::string(local_a88,(string *)(inputFileName.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&p,local_a30);
    wasm::ModuleReader::read(local_a64,local_a88,local_a50,&p);
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::~string(local_a88);
    wasm::ToolOptions::applyOptionsAfterParse((ToolOptions *)local_278,local_a50);
    if (((options._177_1_ & 1) != 0) &&
       (bVar2 = wasm::WasmValidator::validate((Module *)local_c39,(uint)local_a50),
       ((bVar2 ^ 0xff) & 1) != 0)) break;
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&currModule);
    if (bVar1) {
      wasm::Name::Name((Name *)&local_e20,(string *)&iter);
      anon_unknown.dwarf_4289b::mergeInto(local_a50,(Name)local_e20);
      if (((options._177_1_ & 1) != 0) &&
         (bVar2 = wasm::WasmValidator::validate((Module *)&local_e21,0x1b13c0),
         ((bVar2 ^ 0xff) & 1) != 0)) {
        poVar8 = (ostream *)
                 std::operator<<((ostream *)&std::cout,(Module *)(anonymous_namespace)::merged);
        std::operator<<(poVar8,'\n');
        wasm::Fatal::Fatal(&local_fb0);
        pFVar10 = wasm::Fatal::operator<<
                            (&local_fb0,(char (*) [35])"error in validating merged after: ");
        wasm::Fatal::operator<<
                  (pFVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&inputFileName.field_2 + 8));
        wasm::Fatal::~Fatal(&local_fb0);
      }
    }
    else {
      __end3 = std::
               vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ::begin((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        *)(anonymous_namespace)::merged);
      curr = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
             std::
             vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ::end((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    *)(anonymous_namespace)::merged);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                         *)&curr), bVar1) {
        local_de8 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                    ::operator*(&__end3);
        wasm::Name::Name(&local_e08.moduleName,(string *)&iter);
        pEVar9 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           (local_de8);
        local_e08.baseName.super_IString.str._M_len = *(size_t *)pEVar9;
        local_e08.baseName.super_IString.str._M_str = *(char **)(pEVar9 + 8);
        local_e10 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::get
                              (local_de8);
        this = std::
               unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
               ::operator[]((unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                             *)(anonymous_namespace)::exportModuleMap,&local_e10);
        anon_unknown.dwarf_4289b::ExportInfo::operator=(this,&local_e08);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
              ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&currModule);
    std::__cxx11::string::~string(local_a30);
    std::__cxx11::string::~string((string *)&iter);
    std::__cxx11::string::~string((string *)(inputFileName.field_2._M_local_buf + 8));
    inputFile.field_2._12_4_ = inputFile.field_2._12_4_ + 1;
  }
  poVar8 = (ostream *)std::operator<<((ostream *)&std::cout,local_a50);
  std::operator<<(poVar8,'\n');
  wasm::Fatal::Fatal((Fatal *)&__range3);
  pFVar10 = wasm::Fatal::operator<<((Fatal *)&__range3,(char (*) [28])"error in validating input: ")
  ;
  wasm::Fatal::operator<<
            (pFVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&inputFileName.field_2 + 8));
  wasm::Fatal::~Fatal((Fatal *)&__range3);
}

Assistant:

int main(int argc, const char* argv[]) {
  std::vector<std::string> inputFiles;
  std::vector<std::string> inputFileNames;
  bool emitBinary = true;
  bool debugInfo = false;
  std::map<size_t, std::string> inputSourceMapFilenames;
  std::string outputSourceMapFilename;
  std::string outputSourceMapUrl;

  const std::string WasmMergeOption = "wasm-merge options";

  ToolOptions options("wasm-merge",
                      R"(Merge wasm files into one.

For example,

  wasm-merge foo.wasm foo bar.wasm bar -o merged.wasm

will read foo.wasm and bar.wasm, with names 'foo' and 'bar' respectively, so if the second imports from 'foo', we will see that as an import from the first module after the merge. The merged output will be written to merged.wasm.

Note that filenames and modules names are interleaved (which is hopefully less confusing).

Input source maps can be specified by adding an -ism option right after the module name:

  wasm-merge foo.wasm foo -ism foo.wasm.map ...)");

  options
    .add("--output",
         "-o",
         "Output file",
         WasmMergeOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add_positional("INFILE1 NAME1 INFILE2 NAME2 [..]",
                    Options::Arguments::N,
                    [&](Options* o, const std::string& argument) {
                      if (inputFiles.size() == inputFileNames.size()) {
                        inputFiles.push_back(argument);
                      } else {
                        inputFileNames.push_back(argument);
                      }
                    })
    .add("--input-source-map",
         "-ism",
         "Consume source maps from the specified files",
         WasmMergeOption,
         Options::Arguments::N,
         [&](Options* o, const std::string& argument) {
           size_t pos = inputFiles.size();
           if (pos == 0 || pos != inputFileNames.size() ||
               inputSourceMapFilenames.count(pos - 1)) {
             std::cerr << "Option '-ism " << argument
                       << "' should be right after the module name\n";
             exit(EXIT_FAILURE);
           }
           inputSourceMapFilenames.insert({pos - 1, argument});
         })
    .add("--output-source-map",
         "-osm",
         "Emit source map to the specified file",
         WasmMergeOption,
         Options::Arguments::One,
         [&outputSourceMapFilename](Options* o, const std::string& argument) {
           outputSourceMapFilename = argument;
         })
    .add("--output-source-map-url",
         "-osu",
         "Emit specified string as source map URL",
         WasmMergeOption,
         Options::Arguments::One,
         [&outputSourceMapUrl](Options* o, const std::string& argument) {
           outputSourceMapUrl = argument;
         })
    .add("--rename-export-conflicts",
         "-rec",
         "Rename exports to avoid conflicts (rather than error)",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           exportMergeMode = RenameExportConflicts;
         })
    .add("--skip-export-conflicts",
         "-sec",
         "Skip exports that conflict with previous ones",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           exportMergeMode = SkipExportConflicts;
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; });
  options.parse(argc, argv);

  if (inputFiles.size() != inputFileNames.size()) {
    Fatal() << "Please provide an import name for each input file. "
               "In particular, the number of positional inputs must be even as "
               "each wasm binary must be followed by its name.";
  }

  // Process the inputs.
  // TODO: If the inputs are a very large number of small modules then it might
  //       make sense to parallelize this. (If so, then changing the existing
  //       parallelism above in NameMapper might make sense.)

  for (Index i = 0; i < inputFiles.size(); i++) {
    auto inputFile = inputFiles[i];
    auto inputFileName = inputFileNames[i];
    auto iter = inputSourceMapFilenames.find(i);
    auto inputSourceMapFilename =
      (iter == inputSourceMapFilenames.end()) ? "" : iter->second;

    if (options.debug) {
      std::cerr << "reading input '" << inputFile << "' as '" << inputFileName
                << "'...\n";
    }

    // For the first input, we'll just read it in directly. For later inputs,
    // we read them and then merge.
    std::unique_ptr<Module> laterInput;
    Module* currModule;
    if (i == 0) {
      currModule = &merged;
    } else {
      laterInput = std::make_unique<Module>();
      currModule = laterInput.get();
    }

    options.applyOptionsBeforeParse(*currModule);

    ModuleReader reader;
    try {
      reader.read(inputFile, *currModule, inputSourceMapFilename);
    } catch (ParseException& p) {
      p.dump(std::cerr);
      Fatal() << "error in parsing wasm input: " << inputFile;
    }

    options.applyOptionsAfterParse(*currModule);

    if (options.passOptions.validate) {
      if (!WasmValidator().validate(*currModule)) {
        std::cout << *currModule << '\n';
        Fatal() << "error in validating input: " << inputFile;
      }
    }

    if (!laterInput) {
      // This is the very first module, which we read directly into |merged|.
      // The only other operation we need to do is note the exports for later.
      for (auto& curr : merged.exports) {
        exportModuleMap[curr.get()] = ExportInfo{inputFileName, curr->name};
      }
    } else {
      // This is a later module: do a full merge.
      mergeInto(*currModule, inputFileName);

      if (options.passOptions.validate) {
        if (!WasmValidator().validate(merged)) {
          std::cout << merged << '\n';
          Fatal() << "error in validating merged after: " << inputFile;
        }
      }
    }
  }

  // Fuse imports and exports now that everything is all together in the merged
  // module.
  fuseImportsAndExports();

  {
    PassRunner passRunner(&merged);
    // We might have made some globals read from others that now appear after
    // them (if the one they read was appended from a later module). Sort them
    // to fix that. TODO: we could do this only if we actually append globals
    passRunner.add("reorder-globals-always");
    // Remove unused things. This is obviously a useful optimization but it also
    // makes using the output easier: if an import was resolved by an export
    // during the merge, then that import will have no more uses and it will be
    // optimized out (while if we didn't optimize it out then instantiating the
    // module would still be forced to provide something for that import).
    passRunner.add("remove-unused-module-elements");
    passRunner.run();
  }

  // Output.
  if (options.extra.count("output") > 0) {
    ModuleWriter writer(options.passOptions);
    writer.setBinary(emitBinary);
    writer.setDebugInfo(debugInfo);
    if (outputSourceMapFilename.size()) {
      writer.setSourceMapFilename(outputSourceMapFilename);
      writer.setSourceMapUrl(outputSourceMapUrl);
    }
    writer.write(merged, options.extra["output"]);
  }
}